

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::EnsureAuxStatementData(FunctionBody *this)

{
  AuxStatementData **ppAVar1;
  Recycler *pRVar2;
  AuxStatementData *this_00;
  TrackAllocData local_40;
  Recycler *local_18;
  Recycler *recycler;
  FunctionBody *this_local;
  
  recycler = (Recycler *)this;
  ppAVar1 = Memory::WriteBarrierPtr::operator_cast_to_AuxStatementData__
                      ((WriteBarrierPtr *)&(this->m_sourceInfo).m_auxStatementData);
  if (*ppAVar1 == (AuxStatementData *)0x0) {
    pRVar2 = ScriptContext::GetRecycler
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    local_18 = pRVar2;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&AuxStatementData::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x1f38);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_40);
    this_00 = (AuxStatementData *)new<Memory::Recycler>(0x10,pRVar2,0x43c4b0);
    AuxStatementData::AuxStatementData(this_00);
    Memory::WriteBarrierPtr<Js::FunctionBody::AuxStatementData>::operator=
              (&(this->m_sourceInfo).m_auxStatementData,this_00);
  }
  return;
}

Assistant:

void FunctionBody::EnsureAuxStatementData()
    {
        if (m_sourceInfo.m_auxStatementData == nullptr)
        {
            Recycler* recycler = m_scriptContext->GetRecycler();

            // Note: allocating must be consistent with clean up in CleanupToReparse.
            m_sourceInfo.m_auxStatementData = RecyclerNew(recycler, AuxStatementData);
        }
    }